

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O0

void __thiscall
JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::~GrowingArray
          (GrowingArray<unsigned_int,_Memory::HeapAllocator> *this)

{
  Type pHVar1;
  Type puVar2;
  uint32 uVar3;
  long *plVar4;
  long extraout_RDX;
  code *local_40;
  GrowingArray<unsigned_int,_Memory::HeapAllocator> *this_local;
  
  if (this->buffer != (Type)0x0) {
    pHVar1 = this->alloc;
    local_40 = (code *)Memory::TypeAllocatorFunc<Memory::HeapAllocator,_int>::GetFreeFunc();
    plVar4 = (long *)((long)&pHVar1->m_privateHeap + extraout_RDX);
    if (((ulong)local_40 & 1) != 0) {
      local_40 = *(code **)(local_40 + *plVar4 + -1);
    }
    puVar2 = this->buffer;
    uVar3 = UInt32Math::Mul(this->length,4);
    (*local_40)(plVar4,puVar2,uVar3);
  }
  return;
}

Assistant:

~GrowingArray()
        {
            if (buffer != nullptr)
            {
                AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, UInt32Math::Mul(length, sizeof(TValue)));
            }
        }